

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O0

void testBase(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *compextra;
  char *extra;
  int patch;
  int min;
  int maj;
  char *__s2;
  undefined4 local_20;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  __s2 = "\"-dev\"";
  exr_get_library_version
            (&stack0xfffffffffffffff4,&stack0xfffffffffffffff0,&stack0xffffffffffffffec,&local_20);
  if (((in_stack_fffffffffffffff4 == 3) && (in_stack_fffffffffffffff0 == 2)) &&
     (in_stack_ffffffffffffffec == 0)) {
    iVar1 = strcmp((char *)CONCAT44(in_stack_ffffffffffffffe4,local_20),__s2);
    if (iVar1 != 0) goto LAB_0010aa6d;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR testing library, wrong library version: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_fffffffffffffff4);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_fffffffffffffff0);
  poVar2 = std::operator<<(poVar2,".");
  std::ostream::operator<<(poVar2,in_stack_ffffffffffffffec);
  if (*(char *)CONCAT44(in_stack_ffffffffffffffe4,local_20) != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"-");
    std::operator<<(poVar2,(char *)CONCAT44(in_stack_ffffffffffffffe4,local_20));
  }
  poVar2 = std::operator<<((ostream *)&std::cerr," vs compiled in ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  poVar2 = std::operator<<(poVar2,".");
  std::ostream::operator<<(poVar2,0);
  if (*__s2 != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"-");
    std::operator<<(poVar2,__s2);
  }
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  core_test_fail((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe4,__s2);
LAB_0010aa6d:
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing OpenEXR library version: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_fffffffffffffff4);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_fffffffffffffff0);
  poVar2 = std::operator<<(poVar2,".");
  std::ostream::operator<<(poVar2,in_stack_ffffffffffffffec);
  if (*(char *)CONCAT44(in_stack_ffffffffffffffe4,local_20) != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"-");
    std::operator<<(poVar2,(char *)CONCAT44(in_stack_ffffffffffffffe4,local_20));
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  exr_get_library_version(0,&stack0xfffffffffffffff0,&stack0xffffffffffffffec,&local_20);
  exr_get_library_version(&stack0xfffffffffffffff4,0,&stack0xffffffffffffffec,&local_20);
  exr_get_library_version(&stack0xfffffffffffffff4,&stack0xfffffffffffffff0,0,&local_20);
  exr_get_library_version
            (&stack0xfffffffffffffff4,&stack0xfffffffffffffff0,&stack0xffffffffffffffec,0);
  return;
}

Assistant:

void
testBase (const std::string& tempdir)
{
    int         maj, min, patch;
    const char* extra;
    const char* compextra = COMP_EXTRA;

    exr_get_library_version (&maj, &min, &patch, &extra);
    if (maj != COMP_MAJ || min != COMP_MIN || patch != COMP_PATCH ||
        !strcmp (extra, compextra))
    {
        std::cerr << "ERROR testing library, wrong library version: " << maj
                  << "." << min << "." << patch;
        if (extra[0] != '\0') std::cerr << "-" << extra;
        std::cerr << " vs compiled in " << COMP_MAJ << "." << COMP_MIN << "."
                  << COMP_PATCH;
        if (compextra[0] != '\0') std::cerr << "-" << compextra;
        std::cerr << std::endl;
        EXRCORE_TEST (false);
    }
    std::cout << "Testing OpenEXR library version: " << maj << "." << min << "."
              << patch;
    if (extra[0] != '\0') std::cout << "-" << extra;
    std::cout << std::endl;

    exr_get_library_version (NULL, &min, &patch, &extra);
    exr_get_library_version (&maj, NULL, &patch, &extra);
    exr_get_library_version (&maj, &min, NULL, &extra);
    exr_get_library_version (&maj, &min, &patch, NULL);
}